

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.hpp
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
pstore::base32::convert<std::back_insert_iterator<std::__cxx11::string>>
          (base32 *this,uint128 wide,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          out)

{
  const_reference __value;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint64_t in_RDX;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined4 local_44;
  uint64_t uStack_40;
  uint mask;
  uint64_t low;
  uint64_t high;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_local;
  uint128 wide_local;
  
  high = in_RDX;
  out_local.container = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  low = uint128::high((uint128 *)&out_local);
  uStack_40 = uint128::low((uint128 *)&out_local);
  local_44 = 0x1f;
  do {
    __value = std::array<const_char,_32UL>::operator[]
                        ((array<const_char,_32UL> *)"abcdefghijklmnopqrstuvwxyz234567",
                         uStack_40 & 0x1f);
    local_50 = std::
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&high,0);
    this_00 = std::
              back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_50);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(this_00,__value);
    uStack_40 = low << 0x3b | uStack_40 >> 5;
    low = low >> 5;
  } while (uStack_40 != 0 || low != 0);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)high;
}

Assistant:

OutputIterator convert (uint128 const wide, OutputIterator out) {
            auto high = wide.high ();
            auto low = wide.low ();
            constexpr auto mask = (1U << 5) - 1U;
            PSTORE_ASSERT (mask == alphabet.size () - 1U);
            do {
                *(out++) = alphabet[low & mask];
                low >>= 5;
                low |= (high & mask) << (64 - 5);
                high >>= 5;
            } while ((low | high) != 0);
            return out;
        }